

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# l2_storage.c
# Opt level: O3

void * l2_storage_mem_new_with_zero(l2_storage *storage_p,l2_mem_size mem_size)

{
  _l2_mem_link *p_Var1;
  l2_mem_link *plVar2;
  void *val;
  int line;
  l2_storage *plVar3;
  
  p_Var1 = storage_p->head_p;
  if (storage_p->head_p == (l2_mem_link *)0x0) {
    line = 0x3c;
    plVar3 = storage_p;
  }
  else {
    do {
      plVar2 = p_Var1;
      p_Var1 = plVar2->next;
    } while (p_Var1 != (_l2_mem_link *)0x0);
    line = 0x35;
    plVar3 = (l2_storage *)&plVar2->next;
  }
  plVar2 = (l2_mem_link *)malloc(0x10);
  plVar3->head_p = plVar2;
  plVar2->next = (_l2_mem_link *)0x0;
  val = calloc(mem_size,1);
  plVar2->mem_p = val;
  l2_assert_func((long)val,L2_INTERNAL_ERROR_NULL_POINTER,"l2_storage_mem_new_with_zero",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/AloneCafe[P]l2/l2_mem/l2_storage.c"
                 ,line);
  storage_p->size = storage_p->size + 1;
  return plVar3->head_p->mem_p;
}

Assistant:

void *l2_storage_mem_new_with_zero(l2_storage *storage_p, l2_mem_size mem_size) {
    if (storage_p->head_p) {
        l2_mem_link *mem_link;
        for (mem_link = storage_p->head_p; mem_link->next != L2_NULL_PTR; mem_link = mem_link->next);
        mem_link->next = malloc(sizeof(l2_mem_link));
        mem_link->next->next = L2_NULL_PTR;
        l2_assert(mem_link->next->mem_p = calloc(mem_size, 1), L2_INTERNAL_ERROR_NULL_POINTER);
        storage_p->size += 1;
        return mem_link->next->mem_p;

    } else {
        storage_p->head_p = malloc(sizeof(l2_mem_link));
        storage_p->head_p->next = L2_NULL_PTR;
        l2_assert(storage_p->head_p->mem_p = calloc(mem_size, 1), L2_INTERNAL_ERROR_NULL_POINTER);
        storage_p->size += 1;
        return storage_p->head_p->mem_p;
    }
}